

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,Socket *netSocket)

{
  string_view fmt;
  debug<> local_29;
  srcLoc local_28;
  
  http::std::experimental::net::v1::
  basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  ::basic_io_object((basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                     *)this,(basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                             *)netSocket);
  FrameDecoder::FrameDecoder(&this->decoder);
  (this->closeHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->closeHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->closeHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->closeHandler).super__Function_base._M_functor + 8) = 0;
  (this->binaryHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->binaryHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->binaryHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->binaryHandler).super__Function_base._M_functor + 8) = 0;
  (this->textHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->textHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->textHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->textHandler).super__Function_base._M_functor + 8) = 0;
  this->started = false;
  local_28._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0013d4a0;
  fmt._M_str = "WebSocket constructor";
  fmt._M_len = 0x15;
  log::debug<>::debug(&local_29,fmt,&local_28);
  start(this);
  return;
}

Assistant:

explicit WebSocket(typename Net::Socket netSocket) : socket(std::move(netSocket)), started(false) {
        log::debug("WebSocket constructor");
        start();
    }